

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::AddPropagateStatistics::Operation<short,duckdb::TryAddOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  short sVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  short sVar5;
  Value local_70;
  
  sVar1 = NumericStats::GetMin<short>(lstats);
  sVar2 = NumericStats::GetMin<short>(rstats);
  sVar3 = (short)((int)sVar2 + (int)sVar1);
  bVar4 = true;
  if ((int)sVar3 == (int)sVar2 + (int)sVar1) {
    sVar1 = NumericStats::GetMax<short>(lstats);
    sVar2 = NumericStats::GetMax<short>(rstats);
    sVar5 = (short)((int)sVar2 + (int)sVar1);
    if ((int)sVar5 == (int)sVar2 + (int)sVar1) {
      Value::Numeric(&local_70,type,(long)sVar3);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)sVar5);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}